

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O1

void duckdb::Node15Leaf::GrowNode7Leaf(ART *art,Node *node15_leaf,Node *node7_leaf)

{
  byte *pbVar1;
  data_t dVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  type paVar5;
  long *plVar6;
  pointer this;
  data_ptr_t pdVar7;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *pBVar8;
  __hash_code __code;
  ulong uVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  
  uVar10 = (node7_leaf->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar5->_M_elems[6].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar10 & 0xffffffff;
  plVar6 = *(long **)(*(long *)&((_Var3._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var3._M_head_impl)->buffers + 8)) * 8);
  for (plVar11 = (long *)*plVar6; uVar9 != plVar11[1]; plVar11 = (long *)*plVar11) {
    plVar6 = plVar11;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar6 + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar12 = (ulong)((uint)(uVar10 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pbVar1 = pdVar7 + iVar4 + lVar12;
  pBVar8 = BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::New(art,node15_leaf);
  (node15_leaf->super_IndexPointer).data =
       (node7_leaf->super_IndexPointer).data & 0x8000000000000000 |
       (node15_leaf->super_IndexPointer).data & 0x7fffffffffffffff;
  dVar2 = pdVar7[iVar4 + lVar12];
  pBVar8->count = dVar2;
  if (dVar2 != '\0') {
    uVar10 = 0;
    do {
      pBVar8->key[uVar10] = pbVar1[uVar10 + 1];
      uVar10 = uVar10 + 1;
    } while (uVar10 < *pbVar1);
  }
  *pbVar1 = 0;
  Node::Free(art,node7_leaf);
  return;
}

Assistant:

void Node15Leaf::GrowNode7Leaf(ART &art, Node &node15_leaf, Node &node7_leaf) {
	auto &n7 = Node::Ref<Node7Leaf>(art, node7_leaf, NType::NODE_7_LEAF);
	auto &n15 = New(art, node15_leaf);
	node15_leaf.SetGateStatus(node7_leaf.GetGateStatus());

	n15.count = n7.count;
	for (uint8_t i = 0; i < n7.count; i++) {
		n15.key[i] = n7.key[i];
	}

	n7.count = 0;
	Node::Free(art, node7_leaf);
}